

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::SpecparamDeclarationSyntax::setChild
          (SpecparamDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004c485c + *(int *)(&DAT_004c485c + index * 4)))();
  return;
}

Assistant:

void SpecparamDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: type = child.node() ? &child.node()->as<ImplicitTypeSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<SpecparamDeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}